

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileBuffer.cpp
# Opt level: O1

bufsize_t AbstractFileBuffer::dump(QString *path,AbstractByteBuffer *bBuf,bool allowExceptions)

{
  char cVar1;
  int iVar2;
  undefined4 extraout_var;
  bufsize_t bVar3;
  FileBufferException *pFVar4;
  QFile fOut;
  QFile local_80 [16];
  QString local_70;
  QString local_58;
  QString local_40;
  
  iVar2 = (*bBuf->_vptr_AbstractByteBuffer[3])(bBuf);
  (*bBuf->_vptr_AbstractByteBuffer[2])(bBuf);
  if (CONCAT44(extraout_var,iVar2) == 0) {
    if (allowExceptions) {
      pFVar4 = (FileBufferException *)__cxa_allocate_exception(0x48);
      QString::QString(&local_40,"Buffer is empty");
      FileBufferException::FileBufferException(pFVar4,&local_40);
      __cxa_throw(pFVar4,&FileBufferException::typeinfo,CustomException::~CustomException);
    }
    bVar3 = 0;
  }
  else {
    QFile::QFile(local_80,(QString *)path);
    cVar1 = QFile::open(local_80,2);
    if (cVar1 == '\0') {
      if (allowExceptions) {
        pFVar4 = (FileBufferException *)__cxa_allocate_exception(0x48);
        operator+(&local_70,"Cannot open the file: ",path);
        operator+(&local_58,&local_70," for writing");
        FileBufferException::FileBufferException(pFVar4,&local_58);
        __cxa_throw(pFVar4,&FileBufferException::typeinfo,CustomException::~CustomException);
      }
      bVar3 = 0;
    }
    else {
      bVar3 = QIODevice::write((char *)local_80,CONCAT44(extraout_var,iVar2));
      QFileDevice::close();
    }
    QFile::~QFile(local_80);
  }
  return bVar3;
}

Assistant:

bufsize_t AbstractFileBuffer::dump(const QString &path, AbstractByteBuffer &bBuf, bool allowExceptions)
{
    BYTE* buf = bBuf.getContent();
    bufsize_t bufSize  = bBuf.getContentSize();
    if (buf == NULL) {
        if (allowExceptions) throw FileBufferException("Buffer is empty");
        return 0;
    }
    QFile fOut(path);
    if (fOut.open(QFile::WriteOnly) == false) {
        if (allowExceptions) throw FileBufferException("Cannot open the file: " + path + " for writing");
        return 0;
    }
    bufsize_t wrote = static_cast<bufsize_t> (fOut.write((char*)buf, bufSize));
    fOut.close();
    return wrote;
}